

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTimestamp.cxx
# Opt level: O0

string * __thiscall
cmTimestamp::FileModificationTime
          (string *__return_storage_ptr__,cmTimestamp *this,char *path,string *formatString,
          bool utcFlag)

{
  uint32_t microseconds_00;
  bool bVar1;
  int iVar2;
  char *path_00;
  string local_270;
  undefined1 local_250 [8];
  uv_fs_t req;
  time_t tStack_90;
  uint32_t microseconds;
  time_t mtime;
  allocator<char> local_71;
  string local_70;
  undefined1 local_50 [8];
  string real_path;
  bool utcFlag_local;
  string *formatString_local;
  char *path_local;
  cmTimestamp *this_local;
  
  real_path.field_2._M_local_buf[0xf] = utcFlag;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,path,&local_71);
  cmSystemTools::GetRealPathResolvingWindowsSubst((string *)local_50,&local_70,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator(&local_71);
  bVar1 = cmsys::SystemTools::FileExists((string *)local_50);
  if (bVar1) {
    tStack_90 = 0;
    req.bufsml[3].len._4_4_ = 0;
    path_00 = (char *)std::__cxx11::string::c_str();
    iVar2 = uv_fs_stat((uv_loop_t *)0x0,(uv_fs_t *)local_250,path_00,(uv_fs_cb)0x0);
    if (iVar2 == 0) {
      tStack_90 = req.statbuf.st_atim.tv_nsec;
      req.bufsml[3].len._4_4_ = (uint32_t)(req.statbuf.st_mtim.tv_sec / 1000);
    }
    uv_fs_req_cleanup((uv_fs_t *)local_250);
    microseconds_00 = req.bufsml[3].len._4_4_;
    std::__cxx11::string::string((string *)&local_270,(string *)formatString);
    CreateTimestampFromTimeT
              (__return_storage_ptr__,this,tStack_90,microseconds_00,&local_270,
               (bool)(real_path.field_2._M_local_buf[0xf] & 1));
    std::__cxx11::string::~string((string *)&local_270);
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__);
  }
  std::__cxx11::string::~string((string *)local_50);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTimestamp::FileModificationTime(const char* path,
                                              const std::string& formatString,
                                              bool utcFlag) const
{
  std::string real_path =
    cmSystemTools::GetRealPathResolvingWindowsSubst(path);

  if (!cmsys::SystemTools::FileExists(real_path)) {
    return std::string();
  }

  // use libuv's implementation of stat(2) to get the file information
  time_t mtime = 0;
  uint32_t microseconds = 0;
  uv_fs_t req;
  if (uv_fs_stat(nullptr, &req, real_path.c_str(), nullptr) == 0) {
    mtime = static_cast<time_t>(req.statbuf.st_mtim.tv_sec);
    // tv_nsec has nanosecond resolution, but we truncate it to microsecond
    // resolution in order to be consistent with cmTimestamp::CurrentTime()
    microseconds = static_cast<uint32_t>(req.statbuf.st_mtim.tv_nsec / 1000);
  }
  uv_fs_req_cleanup(&req);

  return this->CreateTimestampFromTimeT(mtime, microseconds, formatString,
                                        utcFlag);
}